

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QString * __thiscall QDomElementPrivate::text(QDomElementPrivate *this)

{
  long lVar1;
  bool bVar2;
  size_t in_RSI;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  QString *t;
  QDomNodePrivate *in_stack_ffffffffffffff88;
  QDomNodePrivate *this_00;
  char16_t *in_stack_ffffffffffffffa8;
  long lVar3;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  ((DataPointer *)&in_RDI->_vptr_QDomNodePrivate)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->ref = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->prev = (QDomNodePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffffa8,in_RSI);
  for (lVar3 = *(long *)(in_RSI + 0x28); lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x18)) {
    bVar2 = QDomNodePrivate::isText(this_00);
    if ((bVar2) || (bVar2 = QDomNodePrivate::isCDATASection((QDomNodePrivate *)0x11657e), bVar2)) {
      QDomNodePrivate::nodeValue(in_stack_ffffffffffffff88);
      QString::operator+=((QString *)this_00,(QString *)in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x1165ac);
    }
    else {
      bVar2 = QDomNodePrivate::isElement((QDomNodePrivate *)0x1165b8);
      if (bVar2) {
        text((QDomElementPrivate *)CONCAT17(uVar4,in_stack_ffffffffffffffb0));
        QString::operator+=((QString *)this_00,(QString *)in_stack_ffffffffffffff88);
        QString::~QString((QString *)0x1165e6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDomElementPrivate::text()
{
    QString t(u""_s);

    QDomNodePrivate* p = first;
    while (p) {
        if (p->isText() || p->isCDATASection())
            t += p->nodeValue();
        else if (p->isElement())
            t += static_cast<QDomElementPrivate *>(p)->text();
        p = p->next;
    }

    return t;
}